

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::i64_Extend_i32u(w3Interp *this)

{
  uint32_t *puVar1;
  w3Interp *this_local;
  
  puVar1 = w3Stack::u32(&this->super_w3Stack);
  w3Stack::set_u64(&this->super_w3Stack,(ulong)*puVar1);
  return;
}

Assistant:

INTERP (i64_Extend_i32u)
{
    set_u64 ((uint64_t)u32 ());
}